

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O2

void xLearn::RMSDMetric::rmsd_accum_thread
               (vector<float,_std::allocator<float>_> *Y,vector<float,_std::allocator<float>_> *pred
               ,real_t *error,size_t start_idx,size_t end_idx)

{
  float *pfVar1;
  float *pfVar2;
  ostream *poVar3;
  size_t i;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  allocator local_56;
  allocator local_55;
  Logger local_54;
  string local_50;
  string local_30;
  
  if (start_idx <= end_idx) {
    *error = 0.0;
    auVar4 = ZEXT816(0) << 0x40;
    while (end_idx != start_idx) {
      pfVar1 = (Y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start + start_idx;
      pfVar2 = (pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start + start_idx;
      start_idx = start_idx + 1;
      auVar5 = ZEXT416((uint)(*pfVar1 - *pfVar2));
      auVar4 = vfmadd231ss_fma(auVar4,auVar5,auVar5);
      *error = auVar4._0_4_;
    }
    return;
  }
  local_54.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
             ,&local_55);
  std::__cxx11::string::string((string *)&local_50,"rmsd_accum_thread",&local_56);
  poVar3 = Logger::Start(ERR,&local_30,0x30a,&local_50);
  poVar3 = std::operator<<(poVar3,"CHECK_GE failed ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x30a);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"end_idx");
  poVar3 = std::operator<<(poVar3," = ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"start_idx");
  poVar3 = std::operator<<(poVar3," = ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  Logger::~Logger(&local_54);
  abort();
}

Assistant:

static void rmsd_accum_thread(const std::vector<real_t>* Y,
                                const std::vector<real_t>* pred,
                                real_t* error,
                                size_t start_idx,
                                size_t end_idx) {
    CHECK_GE(end_idx, start_idx);
    *error = 0;
    for (size_t i = start_idx; i < end_idx; ++i) {
      real_t tmp = (*Y)[i] - (*pred)[i];
      (*error) += tmp * tmp;
    }
  }